

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dict.cpp
# Opt level: O0

MDDEntry * __thiscall ASDCP::Dictionary::FindULAnyVersion(Dictionary *this,byte_t *ul_buf)

{
  const_iterator cVar1;
  bool bVar2;
  pointer ppVar3;
  ILogSink *this_00;
  char *pcVar4;
  char local_d8 [8];
  char buf [64];
  _Self local_90 [3];
  UL local_78;
  _Self local_58;
  const_iterator lower;
  MDDEntry *found_entry;
  UL target;
  byte_t search_ul [16];
  byte_t *ul_buf_local;
  Dictionary *this_local;
  
  if (*this->m_MDD_Table[0].name == '\0') {
    __assert_fail("m_MDD_Table[0].name[0]",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Dict.cpp"
                  ,0x130,
                  "const ASDCP::MDDEntry *ASDCP::Dictionary::FindULAnyVersion(const byte_t *) const"
                 );
  }
  target.super_Identifier<16U>._24_7_ = SUB87(*(undefined8 *)ul_buf,0);
  target.super_Identifier<16U>._31_1_ = 0;
  UL::UL((UL *)&found_entry,ul_buf);
  lower._M_node = (_Base_ptr)0x0;
  UL::UL(&local_78,target.super_Identifier<16U>.m_Value + 0xf);
  local_58._M_node =
       (_Base_ptr)
       std::
       map<ASDCP::UL,_unsigned_int,_std::less<ASDCP::UL>,_std::allocator<std::pair<const_ASDCP::UL,_unsigned_int>_>_>
       ::lower_bound(&this->m_md_lookup,&local_78);
  UL::~UL(&local_78);
  do {
    local_90[0]._M_node =
         (_Base_ptr)
         std::
         map<ASDCP::UL,_unsigned_int,_std::less<ASDCP::UL>,_std::allocator<std::pair<const_ASDCP::UL,_unsigned_int>_>_>
         ::end(&this->m_md_lookup);
    bVar2 = std::operator!=(&local_58,local_90);
    if (!bVar2) {
LAB_0022b634:
      if (lower._M_node == (_Base_ptr)0x0) {
        this_00 = (ILogSink *)Kumu::DefaultLogSink();
        pcVar4 = UL::EncodeString((UL *)&found_entry,local_d8,0x40);
        Kumu::ILogSink::Warn(this_00,"UL Dictionary: unknown UL: %s\n",pcVar4);
      }
      cVar1._M_node = lower._M_node;
      UL::~UL((UL *)&found_entry);
      return (MDDEntry *)cVar1._M_node;
    }
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_ASDCP::UL,_unsigned_int>_>::operator->
                       (&local_58);
    bVar2 = UL::MatchExact(&ppVar3->first,(UL *)&found_entry);
    if (bVar2) {
      ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_ASDCP::UL,_unsigned_int>_>::operator->
                         (&local_58);
      lower._M_node = (_Base_ptr)(this->m_MDD_Table + ppVar3->second);
      goto LAB_0022b634;
    }
    if (lower._M_node == (_Base_ptr)0x0) {
      ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_ASDCP::UL,_unsigned_int>_>::operator->
                         (&local_58);
      bVar2 = UL::MatchIgnoreStream(&ppVar3->first,(UL *)&found_entry);
      if (!bVar2) goto LAB_0022b585;
      ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_ASDCP::UL,_unsigned_int>_>::operator->
                         (&local_58);
      lower._M_node = (_Base_ptr)(this->m_MDD_Table + ppVar3->second);
    }
    else {
LAB_0022b585:
      if (lower._M_node == (_Base_ptr)0x0) {
        ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_ASDCP::UL,_unsigned_int>_>::operator->
                           (&local_58);
        bVar2 = UL::MatchIgnorePlaceholder(&ppVar3->first,(UL *)&found_entry);
        if (bVar2) {
          ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_ASDCP::UL,_unsigned_int>_>::
                   operator->(&local_58);
          lower._M_node = (_Base_ptr)(this->m_MDD_Table + ppVar3->second);
          goto LAB_0022b622;
        }
      }
      if (lower._M_node != (_Base_ptr)0x0) {
        ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_ASDCP::UL,_unsigned_int>_>::operator->
                           (&local_58);
        bVar2 = UL::MatchIgnoreStream(&ppVar3->first,(UL *)&found_entry);
        if (!bVar2) goto LAB_0022b634;
      }
    }
LAB_0022b622:
    std::_Rb_tree_const_iterator<std::pair<const_ASDCP::UL,_unsigned_int>_>::operator++(&local_58);
  } while( true );
}

Assistant:

const ASDCP::MDDEntry*
ASDCP::Dictionary::FindULAnyVersion(const byte_t* ul_buf) const
{
  assert(m_MDD_Table[0].name[0]);
  byte_t search_ul[SMPTE_UL_LENGTH];
  memcpy(search_ul, ul_buf, SMPTE_UL_LENGTH);
  memset(search_ul+7, 0, SMPTE_UL_LENGTH-7);

  UL target(ul_buf);
  const ASDCP::MDDEntry *found_entry = 0;

  std::map<UL, ui32_t>::const_iterator lower = m_md_lookup.lower_bound(UL(search_ul));

  for ( ; lower != m_md_lookup.end(); ++lower )
    {
      if ( lower->first.MatchExact(target) )
	{
	  found_entry = &m_MDD_Table[lower->second];
	  break;
	}
      else if ( found_entry == 0 && lower->first.MatchIgnoreStream(target) )
	{
	  found_entry = &m_MDD_Table[lower->second];
	}
      else if ( found_entry == 0 && lower->first.MatchIgnorePlaceholder(target) )
	{
	  found_entry = &m_MDD_Table[lower->second];
	}
      else if ( found_entry != 0 && ! lower->first.MatchIgnoreStream(target) )
	{
	  break;
	}
    }

  if ( found_entry == 0 )
    {
      char buf[64];
      Kumu::DefaultLogSink().Warn("UL Dictionary: unknown UL: %s\n", target.EncodeString(buf, 64));
    }

  return found_entry;
}